

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModelHelpers.c
# Opt level: O2

JL_STATUS JlCreateNumberS64Object(int64_t NumberS64,JlDataObject **pNumberObject)

{
  JL_STATUS JVar1;
  JlDataObject *numberObject;
  
  numberObject = (JlDataObject *)0x0;
  if (pNumberObject == (JlDataObject **)0x0) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pNumberObject = (JlDataObject *)0x0;
    JVar1 = JlCreateObject(JL_DATA_TYPE_NUMBER,&numberObject);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlSetObjectNumberS64(numberObject,NumberS64);
      if (JVar1 == JL_STATUS_SUCCESS) {
        *pNumberObject = numberObject;
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JlFreeObjectTree(&numberObject);
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlCreateNumberS64Object
    (
        int64_t             NumberS64,          // [in]
        JlDataObject**      pNumberObject       // [out]
    )
{
    JL_STATUS jlStatus;
    JlDataObject* numberObject = NULL;

    if( NULL != pNumberObject )
    {
        *pNumberObject = NULL;

        jlStatus = JlCreateObject( JL_DATA_TYPE_NUMBER, &numberObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlSetObjectNumberS64( numberObject, NumberS64 );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pNumberObject = numberObject;
            }
            else
            {
                JlFreeObjectTree( &numberObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}